

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cpp
# Opt level: O0

Matrix3d * __thiscall Pose::QtoR(Matrix3d *__return_storage_ptr__,Pose *this,Vector4d *Q)

{
  Scalar *pSVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar2;
  double dVar3;
  double dVar4;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_a8;
  double local_88;
  double R33;
  double R23;
  double R13;
  double R32;
  double R22;
  double R12;
  double R31;
  double R21;
  double R11;
  double w;
  double z;
  double y;
  double x;
  Vector4d *Q_local;
  Pose *this_local;
  Matrix3d *R;
  
  x = (double)Q;
  Q_local = (Vector4d *)this;
  this_local = (Pose *)__return_storage_ptr__;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Q,0);
  y = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Q,1);
  z = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Q,2);
  w = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Q,3);
  R11 = *pSVar1;
  dVar3 = pow(z,2.0);
  dVar4 = pow(w,2.0);
  R21 = (1.0 - (dVar3 + dVar3)) - (dVar4 + dVar4);
  R31 = (y + y) * z + (w + w) * R11;
  R12 = (y + y) * w - (z + z) * R11;
  R22 = (y + y) * z - (w + w) * R11;
  dVar3 = pow(y,2.0);
  dVar4 = pow(w,2.0);
  R32 = (1.0 - (dVar3 + dVar3)) - (dVar4 + dVar4);
  R13 = (z + z) * w + (y + y) * R11;
  R23 = (y + y) * w + (z + z) * R11;
  R33 = (z + z) * w - (y + y) * R11;
  dVar3 = pow(y,2.0);
  dVar4 = pow(z,2.0);
  local_88 = (1.0 - (dVar3 + dVar3)) - (dVar4 + dVar4);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(__return_storage_ptr__);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
            (&local_a8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)__return_storage_ptr__,
             &R21);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(&local_a8,&R22)
  ;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&R23);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&R31);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&R32);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&R33);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&R12);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&R13);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&local_88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Matrix3d Pose::QtoR(Vector4d Q){
      // Transform quaternion to rotation matrix
      double x, y, z, w;
      double R11, R21, R31, R12, R22, R32, R13, R23, R33;
      // Read components of quaternion
      x = Q(0);
      y = Q(1);
      z = Q(2);
      w = Q(3);
      // R11 = 1 - 2y^2 - 2z^2
      R11 = 1 - 2*pow(y,2) - 2*pow(z,2);
      // R21 = 2xy + 2zw
      R21 = 2*x*y + 2*z*w;
      // R31 = 2xz - 2yw
      R31 = 2*x*z - 2*y*w;
      // R12 = 2xy - 2zw
      R12 = 2*x*y - 2*z*w;
      // R22 = 1 - 2x^2 - 2z^2
      R22 = 1 - 2*pow(x,2) - 2*pow(z,2);
      // R32 = 2yz + 2xw
      R32 = 2*y*z + 2*x*w;
      // R13 = 2xz + 2yw
      R13 = 2*x*z + 2*y*w;
      // R23 = 2yz - 2xw
      R23 = 2*y*z - 2*x*w;
      // R33 = 1 - 2x^2 - 2y^2
      R33 = 1 - 2*pow(x,2) - 2*pow(y,2);
      // Define rotation matrix
      Matrix3d R;
      R <<  R11, R12, R13,
            R21, R22, R23,
            R31, R32, R33;
      // Return rotation matrix
      return R;
}